

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

ssize_t ossl_recv(connectdata *conn,int num,char *buf,size_t buffersize,CURLcode *curlcode)

{
  Curl_easy *data;
  int ret_code;
  int err;
  CURLcode CVar1;
  ulong e;
  char *pcVar2;
  uint *puVar3;
  size_t sVar4;
  long lVar5;
  char error_buffer [256];
  char acStack_138 [264];
  
  pcVar2 = acStack_138;
  ERR_clear_error();
  sVar4 = 0x7fffffff;
  if (buffersize < 0x7fffffff) {
    sVar4 = buffersize;
  }
  ret_code = SSL_read((SSL *)(conn->ssl[num].backend)->handle,buf,(int)sVar4);
  lVar5 = (long)ret_code;
  if (0 < ret_code) {
    return lVar5;
  }
  err = SSL_get_error((SSL *)(conn->ssl[num].backend)->handle,ret_code);
  CVar1 = CURLE_AGAIN;
  if (1 < err - 2U) {
    if (err == 0) {
      return lVar5;
    }
    if (err == 6) {
      return lVar5;
    }
    e = ERR_get_error();
    if (e == 0 && ret_code == 0) {
      return 0;
    }
    data = conn->data;
    if (e == 0) {
      pcVar2 = SSL_ERROR_to_str(err);
    }
    else {
      ERR_error_string_n(e,acStack_138,0x100);
    }
    puVar3 = (uint *)__errno_location();
    Curl_failf(data,"OpenSSL SSL_read: %s, errno %d",pcVar2,(ulong)*puVar3);
    CVar1 = CURLE_RECV_ERROR;
  }
  *curlcode = CVar1;
  return -1;
}

Assistant:

static ssize_t ossl_recv(struct connectdata *conn, /* connection data */
                         int num,                  /* socketindex */
                         char *buf,                /* store read data here */
                         size_t buffersize,        /* max amount to read */
                         CURLcode *curlcode)
{
  char error_buffer[256];
  unsigned long sslerror;
  ssize_t nread;
  int buffsize;
  struct ssl_connect_data *connssl = &conn->ssl[num];

  ERR_clear_error();

  buffsize = (buffersize > (size_t)INT_MAX) ? INT_MAX : (int)buffersize;
  nread = (ssize_t)SSL_read(BACKEND->handle, buf, buffsize);
  if(nread <= 0) {
    /* failed SSL_read */
    int err = SSL_get_error(BACKEND->handle, (int)nread);

    switch(err) {
    case SSL_ERROR_NONE: /* this is not an error */
    case SSL_ERROR_ZERO_RETURN: /* no more data */
      break;
    case SSL_ERROR_WANT_READ:
    case SSL_ERROR_WANT_WRITE:
      /* there's data pending, re-invoke SSL_read() */
      *curlcode = CURLE_AGAIN;
      return -1;
    default:
      /* openssl/ssl.h for SSL_ERROR_SYSCALL says "look at error stack/return
         value/errno" */
      /* https://www.openssl.org/docs/crypto/ERR_get_error.html */
      sslerror = ERR_get_error();
      if((nread < 0) || sslerror) {
        /* If the return code was negative or there actually is an error in the
           queue */
        failf(conn->data, OSSL_PACKAGE " SSL_read: %s, errno %d",
              (sslerror ?
               ossl_strerror(sslerror, error_buffer, sizeof(error_buffer)) :
               SSL_ERROR_to_str(err)),
              SOCKERRNO);
        *curlcode = CURLE_RECV_ERROR;
        return -1;
      }
    }
  }
  return nread;
}